

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O1

int32_t uprv_compareEBCDICPropertyNames_63(char *name1,char *name2)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
LAB_0029c58a:
  uVar6 = 0x100;
  pbVar3 = (byte *)name1;
  do {
    bVar1 = *pbVar3;
    uVar4 = (ulong)bVar1;
    if (uVar4 < 0x26) {
      if ((0x2000203820U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0) goto LAB_0029c5a7;
        goto LAB_0029c5cf;
      }
    }
    else {
LAB_0029c5a7:
      if ((0x2d < bVar1 - 0x40) || ((0x200100000001U >> ((ulong)(bVar1 - 0x40) & 0x3f) & 1) == 0))
      break;
    }
    pbVar3 = pbVar3 + 1;
    uVar6 = uVar6 + 0x100;
  } while( true );
  bVar1 = uprv_ebcdictolower_63(bVar1);
  uVar6 = uVar6 + bVar1;
LAB_0029c5cf:
  uVar5 = 0x100;
  pbVar3 = (byte *)name2;
  do {
    bVar1 = *pbVar3;
    uVar4 = (ulong)bVar1;
    if (uVar4 < 0x26) {
      if ((0x2000203820U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0) goto LAB_0029c5eb;
        goto LAB_0029c611;
      }
    }
    else {
LAB_0029c5eb:
      if ((0x2d < bVar1 - 0x40) || ((0x200100000001U >> ((ulong)(bVar1 - 0x40) & 0x3f) & 1) == 0))
      break;
    }
    pbVar3 = pbVar3 + 1;
    uVar5 = uVar5 + 0x100;
  } while( true );
  bVar1 = uprv_ebcdictolower_63(bVar1);
  uVar5 = uVar5 + bVar1;
LAB_0029c611:
  if ((char)uVar5 == '\0' && (char)uVar6 == '\0') {
    return 0;
  }
  if ((uVar6 != uVar5) && (iVar2 = (uVar6 & 0xff) - (uVar5 & 0xff), iVar2 != 0)) {
    return iVar2;
  }
  name1 = (char *)((byte *)name1 + ((int)uVar6 >> 8));
  name2 = (char *)((byte *)name2 + ((int)uVar5 >> 8));
  goto LAB_0029c58a;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_compareEBCDICPropertyNames(const char *name1, const char *name2) {
    int32_t rc, r1, r2;

    for(;;) {
        r1=getEBCDICPropertyNameChar(name1);
        r2=getEBCDICPropertyNameChar(name2);

        /* If we reach the ends of both strings then they match */
        if(((r1|r2)&0xff)==0) {
            return 0;
        }

        /* Compare the lowercased characters */
        if(r1!=r2) {
            rc=(r1&0xff)-(r2&0xff);
            if(rc!=0) {
                return rc;
            }
        }

        name1+=r1>>8;
        name2+=r2>>8;
    }
}